

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O0

bool __thiscall
Json::OurReader::addError(OurReader *this,string *message,Token *token,Location extra)

{
  undefined8 in_RCX;
  string *in_RSI;
  deque<Json::OurReader::ErrorInfo,_std::allocator<Json::OurReader::ErrorInfo>_> *in_RDI;
  ErrorInfo info;
  value_type *in_stack_ffffffffffffff78;
  string local_50 [32];
  undefined8 local_30;
  undefined8 local_20;
  string *local_10;
  
  local_20 = in_RCX;
  local_10 = in_RSI;
  ErrorInfo::ErrorInfo((ErrorInfo *)0x151d85);
  std::__cxx11::string::operator=(local_50,local_10);
  local_30 = local_20;
  std::deque<Json::OurReader::ErrorInfo,_std::allocator<Json::OurReader::ErrorInfo>_>::push_back
            (in_RDI,in_stack_ffffffffffffff78);
  ErrorInfo::~ErrorInfo((ErrorInfo *)0x151dd5);
  return false;
}

Assistant:

bool
OurReader::addError(const std::string& message, Token& token, Location extra) {
  ErrorInfo info;
  info.token_ = token;
  info.message_ = message;
  info.extra_ = extra;
  errors_.push_back(info);
  return false;
}